

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_opengl.c
# Opt level: O3

void MOJOSHADER_glEffectCommitChanges(MOJOSHADER_glEffect *glEffect)

{
  uint uVar1;
  uint uVar2;
  MOJOSHADER_symbolRegisterSet MVar3;
  uint uVar4;
  MOJOSHADER_effectParam *pMVar5;
  MOJOSHADER_effectStateChanges *pMVar6;
  uint *puVar7;
  MOJOSHADER_symbol *pMVar8;
  float *pfVar9;
  bool bVar10;
  GLfloat *pGVar11;
  MOJOSHADER_parseData *pMVar12;
  uint uVar13;
  int iVar14;
  long lVar15;
  MOJOSHADER_effectObject *pMVar16;
  ulong uVar17;
  MOJOSHADER_effectObject *pMVar18;
  uint uVar19;
  float *pfVar20;
  MOJOSHADER_preshader *pMVar21;
  uint uVar22;
  ulong uVar23;
  ulong uVar24;
  int iVar25;
  MOJOSHADER_glContext *pMVar26;
  ulong uVar27;
  float selector;
  float local_3c;
  GLfloat *local_38;
  
  pMVar18 = (MOJOSHADER_effectObject *)glEffect->current_vert_raw;
  pMVar16 = (MOJOSHADER_effectObject *)glEffect->current_frag_raw;
  bVar10 = true;
  if (pMVar18 == (MOJOSHADER_effectObject *)0x0) {
    pMVar18 = (MOJOSHADER_effectObject *)0x0;
  }
  else if (*(uint *)((long)pMVar18 + 0xc) != 0) {
    uVar17 = 0;
    do {
      pMVar5 = glEffect->effect->params;
      uVar1 = (*(uint **)((long)pMVar18 + 0x18))[uVar17];
      if (3 < pMVar5[uVar1].value.value_count) {
        iVar25 = 0;
        uVar27 = 0;
        do {
          memcpy(((anon_union_8_2_659cdb1c_for_MOJOSHADER_effectShader_10 *)((long)pMVar18 + 0x40))
                 ->preshader->registers +
                 ((anon_union_8_2_659cdb1c_for_MOJOSHADER_effectShader_10 *)((long)pMVar18 + 0x40))
                 ->preshader->symbols[uVar17].register_index + uVar27,
                 (void *)((long)iVar25 * 4 + (long)pMVar5[uVar1].value.field_4.values),
                 (ulong)(pMVar5[uVar1].value.type.columns << 2));
          uVar27 = uVar27 + 1;
          iVar25 = iVar25 + 4;
        } while (uVar27 < pMVar5[uVar1].value.value_count >> 2);
      }
      uVar17 = uVar17 + 1;
    } while (uVar17 < ((anon_union_8_2_659cdb1c_for_MOJOSHADER_effectShader_10 *)
                      ((long)pMVar18 + 0x40))->preshader->symbol_count);
    MOJOSHADER_runPreshader
              (((anon_union_8_2_659cdb1c_for_MOJOSHADER_effectShader_10 *)((long)pMVar18 + 0x40))->
               preshader,&local_3c);
    uVar1 = *(uint *)((long)glEffect->effect->params[**(uint **)((long)pMVar18 + 0x28)].value.
                            field_4.values + (long)(int)local_3c * 4);
    pMVar18 = glEffect->effect->objects + (int)uVar1;
    lVar15 = 0;
    uVar17 = 0;
    do {
      if (uVar1 == glEffect->shader_indices[uVar17]) {
        glEffect->current_vert =
             (MOJOSHADER_glShader *)((long)&glEffect->shaders->parseData + lVar15);
        break;
      }
      uVar17 = uVar17 + 1;
      lVar15 = lVar15 + 0x10;
    } while (uVar17 < glEffect->num_shaders);
    bVar10 = false;
  }
  if ((pMVar16 == (MOJOSHADER_effectObject *)0x0) || (*(uint *)((long)pMVar16 + 0xc) == 0)) {
    if (bVar10) goto LAB_0010d281;
  }
  else {
    uVar17 = 0;
    do {
      pMVar5 = glEffect->effect->params;
      uVar1 = (*(uint **)((long)pMVar16 + 0x18))[uVar17];
      if (3 < pMVar5[uVar1].value.value_count) {
        iVar25 = 0;
        uVar27 = 0;
        do {
          memcpy(((anon_union_8_2_659cdb1c_for_MOJOSHADER_effectShader_10 *)((long)pMVar16 + 0x40))
                 ->preshader->registers +
                 ((anon_union_8_2_659cdb1c_for_MOJOSHADER_effectShader_10 *)((long)pMVar16 + 0x40))
                 ->preshader->symbols[uVar17].register_index + uVar27,
                 (void *)((long)iVar25 * 4 + (long)pMVar5[uVar1].value.field_4.values),
                 (ulong)(pMVar5[uVar1].value.type.columns << 2));
          uVar27 = uVar27 + 1;
          iVar25 = iVar25 + 4;
        } while (uVar27 < pMVar5[uVar1].value.value_count >> 2);
      }
      uVar17 = uVar17 + 1;
    } while (uVar17 < ((anon_union_8_2_659cdb1c_for_MOJOSHADER_effectShader_10 *)
                      ((long)pMVar16 + 0x40))->preshader->symbol_count);
    MOJOSHADER_runPreshader
              (((anon_union_8_2_659cdb1c_for_MOJOSHADER_effectShader_10 *)((long)pMVar16 + 0x40))->
               preshader,&local_3c);
    uVar1 = *(uint *)((long)glEffect->effect->params[**(uint **)((long)pMVar16 + 0x28)].value.
                            field_4.values + (long)(int)local_3c * 4);
    pMVar16 = glEffect->effect->objects + (int)uVar1;
    lVar15 = 0;
    uVar17 = 0;
    do {
      if (uVar1 == glEffect->shader_indices[uVar17]) {
        glEffect->current_frag =
             (MOJOSHADER_glShader *)((long)&glEffect->shaders->parseData + lVar15);
        break;
      }
      uVar17 = uVar17 + 1;
      lVar15 = lVar15 + 0x10;
    } while (uVar17 < glEffect->num_shaders);
  }
  MOJOSHADER_glBindShaders(glEffect->current_vert,glEffect->current_frag);
  if (glEffect->current_vert_raw != (MOJOSHADER_effectShader *)0x0) {
    pMVar6 = glEffect->effect->state_changes;
    pMVar6->vertex_sampler_state_changes =
         *(MOJOSHADER_samplerStateRegister **)((long)pMVar18 + 0x38);
    pMVar6->vertex_sampler_state_change_count = *(uint *)((long)pMVar18 + 0x30);
  }
  if (glEffect->current_frag_raw != (MOJOSHADER_effectShader *)0x0) {
    pMVar6 = glEffect->effect->state_changes;
    pMVar6->sampler_state_changes = *(MOJOSHADER_samplerStateRegister **)((long)pMVar16 + 0x38);
    pMVar6->sampler_state_change_count = *(uint *)((long)pMVar16 + 0x30);
  }
LAB_0010d281:
  pMVar26 = ctx;
  if (pMVar18 != (MOJOSHADER_effectObject *)0x0) {
    pMVar12 = ((anon_union_8_2_659cdb1c_for_MOJOSHADER_effectShader_10 *)((long)pMVar18 + 0x40))->
              shader;
    uVar1 = pMVar12->symbol_count;
    if ((ulong)uVar1 != 0) {
      pMVar5 = glEffect->effect->params;
      puVar7 = *(uint **)((long)pMVar18 + 0x28);
      pMVar8 = pMVar12->symbols;
      local_38 = (GLfloat *)ctx->vs_reg_file_i;
      uVar17 = 0;
      do {
        uVar2 = puVar7[uVar17];
        uVar13 = pMVar8[uVar17].register_index;
        uVar27 = (ulong)(uVar13 * 4);
        if (pMVar5[uVar2].value.type.parameter_type == MOJOSHADER_SYMTYPE_FLOAT) {
LAB_0010d311:
          pGVar11 = pMVar26->vs_reg_file_f;
LAB_0010d31e:
          memcpy(pGVar11 + uVar27,pMVar5[uVar2].value.field_4.values,
                 (ulong)(pMVar8[uVar17].register_count << 4));
        }
        else {
          MVar3 = pMVar8[uVar17].register_set;
          if (MVar3 == MOJOSHADER_SYMREGSET_FLOAT4) {
            if (pMVar5[uVar2].value.type.parameter_class == MOJOSHADER_SYMCLASS_STRUCT)
            goto LAB_0010d311;
            uVar13 = pMVar5[uVar2].value.type.columns;
            uVar19 = pMVar8[uVar17].register_count;
            iVar25 = 0;
            uVar24 = 0;
            do {
              lVar15 = (long)iVar25;
              iVar14 = (int)uVar27;
              uVar23 = (ulong)(uVar13 + (uVar13 == 0));
              do {
                pMVar26->vs_reg_file_f[uVar27] =
                     (float)*(int *)((long)pMVar5[uVar2].value.field_4.values + lVar15 * 4);
                uVar27 = (ulong)((int)uVar27 + 1);
                lVar15 = lVar15 + 1;
                uVar23 = uVar23 - 1;
              } while (uVar23 != 0);
              uVar24 = uVar24 + 1;
              uVar27 = (ulong)(iVar14 + 4);
              iVar25 = iVar25 + 4;
            } while (uVar24 != uVar19 + (uVar19 == 0));
          }
          else {
            pGVar11 = local_38;
            if (MVar3 == MOJOSHADER_SYMREGSET_INT4) goto LAB_0010d31e;
            if (MVar3 == MOJOSHADER_SYMREGSET_BOOL) {
              iVar25 = 0;
              uVar19 = 0;
              do {
                uVar27 = 1;
                do {
                  pMVar26->vs_reg_file_b[(uVar13 & 0x3fffffff) + uVar19] =
                       *(uint8 *)((long)pMVar5[uVar2].value.field_4.values +
                                 uVar27 * 4 + (long)iVar25 * 4 + -4);
                  uVar19 = uVar19 + 1;
                  if (pMVar5[uVar2].value.type.columns <= uVar27) break;
                  uVar27 = uVar27 + 1;
                } while (uVar19 < pMVar8[uVar17].register_count);
                iVar25 = iVar25 + 4;
              } while (uVar19 < pMVar8[uVar17].register_count);
            }
          }
        }
        uVar17 = uVar17 + 1;
      } while (uVar17 != uVar1);
      pMVar12 = ((anon_union_8_2_659cdb1c_for_MOJOSHADER_effectShader_10 *)((long)pMVar18 + 0x40))->
                shader;
    }
    pMVar21 = pMVar12->preshader;
    if (pMVar21 != (MOJOSHADER_preshader *)0x0) {
      uVar1 = pMVar21->symbol_count;
      if ((ulong)uVar1 != 0) {
        pMVar5 = glEffect->effect->params;
        puVar7 = *(uint **)((long)pMVar18 + 0x18);
        pMVar8 = pMVar21->symbols;
        pfVar9 = pMVar21->registers;
        uVar17 = 0;
        do {
          uVar2 = puVar7[uVar17];
          uVar13 = pMVar8[uVar17].register_index << 2;
          if (pMVar5[uVar2].value.type.parameter_type == MOJOSHADER_SYMTYPE_FLOAT) {
LAB_0010d481:
            pfVar20 = pfVar9 + uVar13;
LAB_0010d48e:
            memcpy(pfVar20,pMVar5[uVar2].value.field_4.values,
                   (ulong)(pMVar8[uVar17].register_count << 4));
          }
          else {
            MVar3 = pMVar8[uVar17].register_set;
            if (MVar3 == MOJOSHADER_SYMREGSET_FLOAT4) {
              if (pMVar5[uVar2].value.type.parameter_class == MOJOSHADER_SYMCLASS_STRUCT)
              goto LAB_0010d481;
              uVar19 = pMVar5[uVar2].value.type.columns;
              uVar4 = pMVar8[uVar17].register_count;
              iVar25 = 0;
              uVar27 = 0;
              do {
                lVar15 = (long)iVar25;
                uVar24 = (ulong)(uVar19 + (uVar19 == 0));
                uVar22 = uVar13;
                do {
                  pfVar9[uVar22] =
                       (float)*(int *)((long)pMVar5[uVar2].value.field_4.values + lVar15 * 4);
                  uVar22 = uVar22 + 1;
                  lVar15 = lVar15 + 1;
                  uVar24 = uVar24 - 1;
                } while (uVar24 != 0);
                uVar27 = uVar27 + 1;
                uVar13 = uVar13 + 4;
                iVar25 = iVar25 + 4;
              } while (uVar27 != uVar4 + (uVar4 == 0));
            }
            else {
              if (MVar3 == MOJOSHADER_SYMREGSET_INT4) {
                pfVar20 = (float *)((ulong)uVar13 << 2);
                goto LAB_0010d48e;
              }
              if (MVar3 == MOJOSHADER_SYMREGSET_BOOL) {
                uVar13 = 0;
                do {
                  uVar27 = 1;
                  do {
                    uVar13 = uVar13 + 1;
                    if (pMVar5[uVar2].value.type.columns <= uVar27) break;
                    uVar27 = uVar27 + 1;
                  } while (uVar13 < pMVar8[uVar17].register_count);
                } while (uVar13 < pMVar8[uVar17].register_count);
              }
            }
          }
          uVar17 = uVar17 + 1;
        } while (uVar17 != uVar1);
        pMVar21 = ((anon_union_8_2_659cdb1c_for_MOJOSHADER_effectShader_10 *)((long)pMVar18 + 0x40))
                  ->shader->preshader;
        pMVar26 = ctx;
      }
      MOJOSHADER_runPreshader(pMVar21,pMVar26->vs_reg_file_f);
      pMVar26 = ctx;
    }
  }
  if (pMVar16 != (MOJOSHADER_effectObject *)0x0) {
    pMVar12 = ((anon_union_8_2_659cdb1c_for_MOJOSHADER_effectShader_10 *)((long)pMVar16 + 0x40))->
              shader;
    uVar1 = pMVar12->symbol_count;
    if ((ulong)uVar1 != 0) {
      pMVar5 = glEffect->effect->params;
      puVar7 = *(uint **)((long)pMVar16 + 0x28);
      pMVar8 = pMVar12->symbols;
      uVar17 = 0;
      do {
        uVar2 = puVar7[uVar17];
        uVar13 = pMVar8[uVar17].register_index;
        uVar27 = (ulong)(uVar13 * 4);
        if (pMVar5[uVar2].value.type.parameter_type == MOJOSHADER_SYMTYPE_FLOAT) {
LAB_0010d5ef:
          pGVar11 = pMVar26->ps_reg_file_f;
LAB_0010d5f5:
          memcpy(pGVar11 + uVar27,pMVar5[uVar2].value.field_4.values,
                 (ulong)(pMVar8[uVar17].register_count << 4));
        }
        else {
          MVar3 = pMVar8[uVar17].register_set;
          if (MVar3 == MOJOSHADER_SYMREGSET_FLOAT4) {
            if (pMVar5[uVar2].value.type.parameter_class == MOJOSHADER_SYMCLASS_STRUCT)
            goto LAB_0010d5ef;
            uVar13 = pMVar5[uVar2].value.type.columns;
            uVar19 = pMVar8[uVar17].register_count;
            iVar25 = 0;
            uVar24 = 0;
            do {
              lVar15 = (long)iVar25;
              iVar14 = (int)uVar27;
              uVar23 = (ulong)(uVar13 + (uVar13 == 0));
              do {
                pMVar26->ps_reg_file_f[uVar27] =
                     (float)*(int *)((long)pMVar5[uVar2].value.field_4.values + lVar15 * 4);
                uVar27 = (ulong)((int)uVar27 + 1);
                lVar15 = lVar15 + 1;
                uVar23 = uVar23 - 1;
              } while (uVar23 != 0);
              uVar24 = uVar24 + 1;
              uVar27 = (ulong)(iVar14 + 4);
              iVar25 = iVar25 + 4;
            } while (uVar24 != uVar19 + (uVar19 == 0));
          }
          else {
            if (MVar3 == MOJOSHADER_SYMREGSET_INT4) {
              pGVar11 = (GLfloat *)pMVar26->ps_reg_file_i;
              goto LAB_0010d5f5;
            }
            if (MVar3 == MOJOSHADER_SYMREGSET_BOOL) {
              iVar25 = 0;
              uVar19 = 0;
              do {
                uVar27 = 1;
                do {
                  pMVar26->ps_reg_file_b[(uVar13 & 0x3fffffff) + uVar19] =
                       *(uint8 *)((long)pMVar5[uVar2].value.field_4.values +
                                 uVar27 * 4 + (long)iVar25 * 4 + -4);
                  uVar19 = uVar19 + 1;
                  if (pMVar5[uVar2].value.type.columns <= uVar27) break;
                  uVar27 = uVar27 + 1;
                } while (uVar19 < pMVar8[uVar17].register_count);
                iVar25 = iVar25 + 4;
              } while (uVar19 < pMVar8[uVar17].register_count);
            }
          }
        }
        uVar17 = uVar17 + 1;
      } while (uVar17 != uVar1);
      pMVar12 = ((anon_union_8_2_659cdb1c_for_MOJOSHADER_effectShader_10 *)((long)pMVar16 + 0x40))->
                shader;
    }
    pMVar21 = pMVar12->preshader;
    if (pMVar21 != (MOJOSHADER_preshader *)0x0) {
      uVar1 = pMVar21->symbol_count;
      if ((ulong)uVar1 != 0) {
        pMVar5 = glEffect->effect->params;
        puVar7 = *(uint **)((long)pMVar16 + 0x18);
        pMVar8 = pMVar21->symbols;
        pfVar9 = pMVar21->registers;
        uVar17 = 0;
        do {
          uVar2 = puVar7[uVar17];
          uVar13 = pMVar8[uVar17].register_index << 2;
          if (pMVar5[uVar2].value.type.parameter_type == MOJOSHADER_SYMTYPE_FLOAT) {
LAB_0010d755:
            pfVar20 = pfVar9 + uVar13;
LAB_0010d762:
            memcpy(pfVar20,pMVar5[uVar2].value.field_4.values,
                   (ulong)(pMVar8[uVar17].register_count << 4));
          }
          else {
            MVar3 = pMVar8[uVar17].register_set;
            if (MVar3 == MOJOSHADER_SYMREGSET_FLOAT4) {
              if (pMVar5[uVar2].value.type.parameter_class == MOJOSHADER_SYMCLASS_STRUCT)
              goto LAB_0010d755;
              uVar19 = pMVar5[uVar2].value.type.columns;
              uVar4 = pMVar8[uVar17].register_count;
              iVar25 = 0;
              uVar27 = 0;
              do {
                lVar15 = (long)iVar25;
                uVar24 = (ulong)(uVar19 + (uVar19 == 0));
                uVar22 = uVar13;
                do {
                  pfVar9[uVar22] =
                       (float)*(int *)((long)pMVar5[uVar2].value.field_4.values + lVar15 * 4);
                  uVar22 = uVar22 + 1;
                  lVar15 = lVar15 + 1;
                  uVar24 = uVar24 - 1;
                } while (uVar24 != 0);
                uVar27 = uVar27 + 1;
                uVar13 = uVar13 + 4;
                iVar25 = iVar25 + 4;
              } while (uVar27 != uVar4 + (uVar4 == 0));
            }
            else {
              if (MVar3 == MOJOSHADER_SYMREGSET_INT4) {
                pfVar20 = (float *)((ulong)uVar13 << 2);
                goto LAB_0010d762;
              }
              if (MVar3 == MOJOSHADER_SYMREGSET_BOOL) {
                uVar13 = 0;
                do {
                  uVar27 = 1;
                  do {
                    uVar13 = uVar13 + 1;
                    if (pMVar5[uVar2].value.type.columns <= uVar27) break;
                    uVar27 = uVar27 + 1;
                  } while (uVar13 < pMVar8[uVar17].register_count);
                } while (uVar13 < pMVar8[uVar17].register_count);
              }
            }
          }
          uVar17 = uVar17 + 1;
        } while (uVar17 != uVar1);
        pMVar21 = ((anon_union_8_2_659cdb1c_for_MOJOSHADER_effectShader_10 *)((long)pMVar16 + 0x40))
                  ->shader->preshader;
        pMVar26 = ctx;
      }
      MOJOSHADER_runPreshader(pMVar21,pMVar26->ps_reg_file_f);
      pMVar26 = ctx;
    }
  }
  pMVar26->generation = pMVar26->generation + 1;
  return;
}

Assistant:

void MOJOSHADER_glEffectCommitChanges(MOJOSHADER_glEffect *glEffect)
{
    MOJOSHADER_effectShader *rawVert = glEffect->current_vert_raw;
    MOJOSHADER_effectShader *rawFrag = glEffect->current_frag_raw;

    /* Used for shader selection from preshaders */
    int i, j;
    MOJOSHADER_effectValue *param;
    float selector;
    int shader_object;
    int selector_ran = 0;

    /* For effect passes with arrays of shaders, we have to run a preshader
     * that determines which shader to use, based on a parameter's value.
     * -flibit
     */
    // !!! FIXME: We're just running the preshaders every time. Blech. -flibit
    #define SELECT_SHADER_FROM_PRESHADER(raw, gls) \
        if (raw != NULL && raw->is_preshader) \
        { \
            i = 0; \
            do \
            { \
                param = &glEffect->effect->params[raw->preshader_params[i]].value; \
                for (j = 0; j < (param->value_count >> 2); j++) \
                    memcpy(raw->preshader->registers + raw->preshader->symbols[i].register_index + j, \
                           param->valuesI + (j << 2), \
                           param->type.columns << 2); \
            } while (++i < raw->preshader->symbol_count); \
            MOJOSHADER_runPreshader(raw->preshader, &selector); \
            shader_object = glEffect->effect->params[raw->params[0]].value.valuesI[(int) selector]; \
            raw = &glEffect->effect->objects[shader_object].shader; \
            i = 0; \
            do \
            { \
                if (shader_object == glEffect->shader_indices[i]) \
                { \
                    gls = &glEffect->shaders[i]; \
                    break; \
                } \
            } while (++i < glEffect->num_shaders); \
            selector_ran = 1; \
        }
    SELECT_SHADER_FROM_PRESHADER(rawVert, glEffect->current_vert)
    SELECT_SHADER_FROM_PRESHADER(rawFrag, glEffect->current_frag)
    #undef SELECT_SHADER_FROM_PRESHADER
    if (selector_ran)
    {
        MOJOSHADER_glBindShaders(glEffect->current_vert,
                                 glEffect->current_frag);
        if (glEffect->current_vert_raw != NULL)
        {
            glEffect->effect->state_changes->vertex_sampler_state_changes = rawVert->samplers;
            glEffect->effect->state_changes->vertex_sampler_state_change_count = rawVert->sampler_count;
        } // if
        if (glEffect->current_frag_raw != NULL)
        {
            glEffect->effect->state_changes->sampler_state_changes = rawFrag->samplers;
            glEffect->effect->state_changes->sampler_state_change_count = rawFrag->sampler_count;
        } // if
    } // if

    /* This is where parameters are copied into the constant buffers.
     * If you're looking for where things slow down immensely, look at
     * the copy_parameter_data() and MOJOSHADER_runPreshader() functions.
     * -flibit
     */
    // !!! FIXME: We're just copying everything every time. Blech. -flibit
    // !!! FIXME: We're just running the preshaders every time. Blech. -flibit
    // !!! FIXME: Will the preshader ever want int/bool registers? -flibit
    #define COPY_PARAMETER_DATA(raw, stage) \
        if (raw != NULL) \
        { \
            copy_parameter_data(glEffect->effect->params, raw->params, \
                                raw->shader->symbols, \
                                raw->shader->symbol_count, \
                                ctx->stage##_reg_file_f, \
                                ctx->stage##_reg_file_i, \
                                ctx->stage##_reg_file_b); \
            if (raw->shader->preshader) \
            { \
                copy_parameter_data(glEffect->effect->params, raw->preshader_params, \
                                    raw->shader->preshader->symbols, \
                                    raw->shader->preshader->symbol_count, \
                                    raw->shader->preshader->registers, \
                                    NULL, \
                                    NULL); \
                MOJOSHADER_runPreshader(raw->shader->preshader, ctx->stage##_reg_file_f); \
            } \
        }
    COPY_PARAMETER_DATA(rawVert, vs)
    COPY_PARAMETER_DATA(rawFrag, ps)
    #undef COPY_PARAMETER_DATA

    ctx->generation++;
}